

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

UBool __thiscall
icu_63::SimpleTimeZone::inDaylightTime(SimpleTimeZone *this,UDate date,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  GregorianCalendar *this_00;
  UErrorCode *size;
  GregorianCalendar *local_60;
  UBool result;
  GregorianCalendar *gc;
  UErrorCode *status_local;
  UDate date_local;
  SimpleTimeZone *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_00 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)size);
    local_60 = (GregorianCalendar *)0x0;
    if (this_00 != (GregorianCalendar *)0x0) {
      GregorianCalendar::GregorianCalendar(this_00,(TimeZone *)this,status);
      local_60 = this_00;
    }
    if (local_60 == (GregorianCalendar *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      this_local._7_1_ = '\0';
    }
    else {
      Calendar::setTime(&local_60->super_Calendar,date,status);
      iVar2 = (*(local_60->super_Calendar).super_UObject._vptr_UObject[0xc])(local_60,status);
      this_local._7_1_ = (UBool)iVar2;
      if (local_60 != (GregorianCalendar *)0x0) {
        (*(local_60->super_Calendar).super_UObject._vptr_UObject[1])();
      }
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool SimpleTimeZone::inDaylightTime(UDate date, UErrorCode& status) const
{
    // This method is wasteful since it creates a new GregorianCalendar and
    // deletes it each time it is called.  However, this is a deprecated method
    // and provided only for Java compatibility as of 8/6/97 [LIU].
    if (U_FAILURE(status)) return FALSE;
    GregorianCalendar *gc = new GregorianCalendar(*this, status);
    /* test for NULL */
    if (gc == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    gc->setTime(date, status);
    UBool result = gc->inDaylightTime(status);
    delete gc;
    return result;
}